

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

_Bool upb_Arena_IncRefFor(upb_Arena *a,void *owner)

{
  char *pcVar1;
  upb_ArenaInternal *ai;
  uintptr_t uVar2;
  bool bVar3;
  upb_ArenaRoot uVar4;
  
  pcVar1 = a[1].ptr_dont_copy_me__upb_internal_use_only;
  if (((ulong)pcVar1 & 1) == 0) {
    ai = (upb_ArenaInternal *)(a + 1);
    do {
      uVar4 = _upb_Arena_FindRoot(ai);
      uVar2 = uVar4.tagged_count;
      ai = uVar4.root;
      if (((undefined1  [16])uVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("_upb_Arena_IsTaggedRefcount(parent_or_count)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                      ,0x70,"uintptr_t _upb_Arena_RefCountFromTagged(uintptr_t)");
      }
      LOCK();
      bVar3 = uVar2 == ai->parent_or_count;
      if (bVar3) {
        ai->parent_or_count = uVar2 + 2;
      }
      UNLOCK();
    } while (!bVar3);
  }
  return ((ulong)pcVar1 & 1) == 0;
}

Assistant:

bool upb_Arena_IncRefFor(const upb_Arena* a, const void* owner) {
  upb_ArenaInternal* ai = upb_Arena_Internal(a);
  if (_upb_ArenaInternal_HasInitialBlock(ai)) return false;
  upb_ArenaRoot r;
  r.root = ai;

retry:
  r = _upb_Arena_FindRoot(r.root);
  if (upb_Atomic_CompareExchangeWeak(
          &r.root->parent_or_count, &r.tagged_count,
          _upb_Arena_TaggedFromRefcount(
              _upb_Arena_RefCountFromTagged(r.tagged_count) + 1),
          // Relaxed order is safe on success, incrementing the refcount
          // need not perform any synchronization with the eventual free of the
          // arena - that's provided by decrements.
          memory_order_relaxed,
          // Relaxed order is safe on failure as r.tagged_count is immediately
          // overwritten by retrying the find root operation.
          memory_order_relaxed)) {
    // We incremented it successfully, so we are done.
    return true;
  }
  // We failed update due to parent switching on the arena.
  goto retry;
}